

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingRenderCase::iterate
          (SSBOBindingRenderCase *this)

{
  ostringstream *this_00;
  TestType TVar1;
  code *pcVar2;
  bool bVar3;
  bool queryTestPassed;
  int iVar4;
  undefined4 uVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar8;
  bool imageTestPassed;
  int drawCycle;
  long lVar9;
  long lVar10;
  long lVar11;
  GLint val;
  int local_1f8;
  int local_1f4;
  uint local_1f0;
  GLenum prop;
  string *local_1e8;
  string name;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar4 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  lVar9 = (long)(this->super_LayoutBindingRenderCase).m_numBindings;
  prop = 0x9302;
  TVar1 = (this->super_LayoutBindingRenderCase).m_testType;
  LayoutBindingRenderCase::initRenderState(&this->super_LayoutBindingRenderCase);
  if (lVar9 < 1) {
    imageTestPassed = true;
    queryTestPassed = true;
  }
  else {
    local_1f0 = TVar1 - TESTTYPE_BINDING_ARRAY;
    local_1e8 = &(this->super_LayoutBindingRenderCase).m_uniformName;
    queryTestPassed = true;
    local_1f8 = 0;
    iVar4 = 0;
    lVar11 = 0;
    imageTestPassed = true;
    do {
      if (local_1f0 < 2) {
        getUniformName(&name,local_1e8,0,(int)lVar11);
      }
      else {
        getUniformName(&name,local_1e8,(int)lVar11);
      }
      local_1f4 = (this->super_LayoutBindingRenderCase).m_bindings.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar11];
      val = -1;
      pcVar2 = *(code **)(lVar7 + 0x9c8);
      dVar6 = (((this->super_LayoutBindingRenderCase).m_program)->m_program).m_program;
      uVar5 = (**(code **)(lVar7 + 0x9a8))(dVar6,0x92e6,name._M_dataplus._M_p);
      (*pcVar2)(dVar6,0x92e6,uVar5,1,&prop,1,0,&val);
      local_1b0._0_8_ =
           ((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Querying binding point for ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,name._M_dataplus._M_p,name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": ",2);
      std::ostream::operator<<(this_00,val);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," == ",4);
      std::ostream::operator<<(this_00,local_1f4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Binding point query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                      ,0x7dd);
      lVar8 = (long)local_1f8 << 4;
      if (val != local_1f4) {
        queryTestPassed = false;
      }
      lVar10 = 0;
      do {
        (**(code **)(lVar7 + 0x14f0))
                  ((this->super_LayoutBindingRenderCase).m_shaderProgramArrayNdxLoc,
                   (int)lVar10 + iVar4);
        bVar3 = LayoutBindingRenderCase::drawAndVerifyResult
                          (&this->super_LayoutBindingRenderCase,
                           (Vec4 *)((long)((this->m_expectedColors).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar8));
        if (!bVar3) {
          imageTestPassed = false;
        }
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar10 == 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar11 = lVar11 + 1;
      iVar4 = iVar4 + 2;
      local_1f8 = local_1f8 + 2;
    } while (lVar11 != lVar9);
  }
  LayoutBindingRenderCase::setTestResult
            (&this->super_LayoutBindingRenderCase,queryTestPassed,imageTestPassed);
  return STOP;
}

Assistant:

TestCase::IterateResult SSBOBindingRenderCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				iterations		= m_numBindings;
	const glw::GLenum		prop			= GL_BUFFER_BINDING;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	bool					queryTestPassed	= true;
	bool					imageTestPassed = true;

	initRenderState();

	for (int iterNdx = 0; iterNdx < iterations; ++iterNdx)
	{
		// Query binding point
		const std::string	name	= (arrayInstance ? getUniformName(m_uniformName, 0, iterNdx) : getUniformName(m_uniformName, iterNdx));
		const glw::GLint	binding = m_bindings[iterNdx];
		glw::GLint			val		= -1;

		gl.getProgramResourceiv(m_program->getProgram(), GL_SHADER_STORAGE_BLOCK, gl.getProgramResourceIndex(m_program->getProgram(), GL_SHADER_STORAGE_BLOCK, name.c_str() ), 1, &prop, 1, DE_NULL, &val);
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying binding point for " << name << ": " << val << " == " << binding << tcu::TestLog::EndMessage;
		GLU_EXPECT_NO_ERROR(gl.getError(), "Binding point query failed");

		if (val != binding)
			queryTestPassed = false;

		// Draw twice to render both colors within the SSBO
		for (int drawCycle = 0; drawCycle < 2; ++drawCycle)
		{
			// Set the uniform indicating the array index to be used and set the expected color
			const int arrayNdx = iterNdx*2 + drawCycle;
			gl.uniform1i(m_shaderProgramArrayNdxLoc, arrayNdx);

			if (!drawAndVerifyResult(m_expectedColors[arrayNdx]))
				imageTestPassed = false;
		}
	}

	setTestResult(queryTestPassed, imageTestPassed);
	return STOP;
}